

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest04BasicCertificateRevocationTests_::
Section4InvalidOldCRLnextUpdateTest11<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section4InvalidOldCRLnextUpdateTest11
          (Section4InvalidOldCRLnextUpdateTest11<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest04BasicCertificateRevocationTests,
                     Section4InvalidOldCRLnextUpdateTest11) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "OldCRLnextUpdateCACert",
                               "InvalidOldCRLnextUpdateTest11EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "OldCRLnextUpdateCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.4.11";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}